

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

uint8_t * CHUNKCOPY_SAFE(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  uint8_t *puVar1;
  ulong uVar2;
  long in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint64_t from_dist;
  uint64_t safelen;
  uint8_t *local_40;
  uint8_t *local_10;
  uint8_t *local_8;
  
  if (in_RDI == in_RSI) {
    local_8 = in_RDI + (long)in_RDX;
  }
  else {
    puVar1 = (uint8_t *)(in_RCX - (long)in_RDI);
    local_40 = in_RDX;
    if (puVar1 < in_RDX) {
      local_40 = puVar1;
    }
    uVar2 = in_RCX - (long)in_RSI;
    if ((long)uVar2 < 1) {
      uVar2 = -uVar2;
    }
    local_10 = in_RDI;
    if (uVar2 < 8 || puVar1 < (uint8_t *)0x8) {
      while (local_40 != (uint8_t *)0x0) {
        *local_10 = *in_RSI;
        local_40 = local_40 + -1;
        in_RSI = in_RSI + 1;
        local_10 = local_10 + 1;
      }
      local_8 = local_10;
    }
    else {
      local_8 = chunkmemset_c(in_RSI,local_40,(uint)((ulong)in_RCX >> 0x20));
    }
  }
  return local_8;
}

Assistant:

static inline uint8_t *CHUNKCOPY_SAFE(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe)
{
    if (out == from)
        return out + len;

    uint64_t safelen = (safe - out);
    len = MIN(len, safelen);

#ifndef HAVE_MASKED_READWRITE
    uint64_t from_dist = (uint64_t)llabs(safe - from);
    if (UNLIKELY(from_dist < sizeof(chunk_t) || safelen < sizeof(chunk_t))) {
        while (len--) {
            *out++ = *from++;
        }

        return out;
    }
#endif

    return CHUNKMEMSET(out, from, (unsigned)len);
}